

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

void NULLCIO::ReadString(char *buf,uint length)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char local_21;
  char *pcStack_20;
  char ch;
  char *pos;
  char *pcStack_10;
  uint length_local;
  char *buf_local;
  
  if (length != 0) {
    *buf = '\0';
    local_21 = '\0';
    pcStack_20 = buf;
    pos._4_4_ = length;
    pcStack_10 = buf;
    do {
      iVar1 = (*readFunc)(contextFunc,&local_21,1);
      if ((iVar1 == 0) || (local_21 == '\n')) break;
      pcVar3 = pcStack_20 + 1;
      *pcStack_20 = local_21;
      pcVar2 = pcStack_20 + 2;
      pcStack_20 = pcVar3;
    } while (pcVar2 != pcStack_10 + pos._4_4_);
    *pcStack_20 = '\0';
  }
  return;
}

Assistant:

void ReadString(char *buf, unsigned length)
	{
		if(!length)
			return;

		*buf = 0;

		char *pos = buf;
		char ch = 0;

		while(readFunc(contextFunc, &ch, 1))
		{
			if(ch == '\n')
				break;

			*pos++ = ch;

			if(pos + 1 == buf + length)
				break;
		}

		*pos = 0;
	}